

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_internals.c
# Opt level: O2

ErrorNumber test_internals(void)

{
  ErrorNumber EVar1;
  TA_RetCode TVar2;
  ulong uVar3;
  uint local_58 [20];
  
  puts("Testing utility functions");
  EVar1 = allocLib();
  if (EVar1 == TA_TEST_PASS) {
    local_58[0x10] = 0xffffffff;
    local_58[0x11] = 0xffffffff;
    local_58[0x12] = 0xffffffff;
    local_58[0x13] = 0xffffffff;
    local_58[0xc] = 0xffffffff;
    local_58[0xd] = 0xffffffff;
    local_58[0xe] = 0xffffffff;
    local_58[0xf] = 0xffffffff;
    local_58[8] = 0xffffffff;
    local_58[9] = 0xffffffff;
    local_58[10] = 0xffffffff;
    local_58[0xb] = 0xffffffff;
    local_58[4] = 0xffffffff;
    local_58[5] = 0xffffffff;
    local_58[6] = 0xffffffff;
    local_58[7] = 0xffffffff;
    local_58[0] = 0xffffffff;
    local_58[1] = 0xffffffff;
    local_58[2] = 0xffffffff;
    local_58[3] = 0xffffffff;
    TVar2 = circBufferFillFrom0ToSize(1,(int *)local_58);
    if (TVar2 == TA_SUCCESS) {
      for (uVar3 = 0; uVar3 != 4; uVar3 = uVar3 + 1) {
        if (uVar3 != local_58[uVar3]) {
          printf("\nFailed circular buffer test (%d != %d)\n");
          EVar1 = TA_INTERNAL_CIRC_BUFF_FAIL_1;
          goto LAB_00114d52;
        }
      }
      local_58[0x10] = 0xffffffff;
      local_58[0x11] = 0xffffffff;
      local_58[0x12] = 0xffffffff;
      local_58[0x13] = 0xffffffff;
      local_58[0xc] = 0xffffffff;
      local_58[0xd] = 0xffffffff;
      local_58[0xe] = 0xffffffff;
      local_58[0xf] = 0xffffffff;
      local_58[8] = 0xffffffff;
      local_58[9] = 0xffffffff;
      local_58[10] = 0xffffffff;
      local_58[0xb] = 0xffffffff;
      local_58[4] = 0xffffffff;
      local_58[5] = 0xffffffff;
      local_58[6] = 0xffffffff;
      local_58[7] = 0xffffffff;
      local_58[0] = 0xffffffff;
      local_58[1] = 0xffffffff;
      local_58[2] = 0xffffffff;
      local_58[3] = 0xffffffff;
      TVar2 = circBufferFillFrom0ToSize(2,(int *)local_58);
      if (TVar2 == TA_SUCCESS) {
        for (uVar3 = 0; uVar3 != 5; uVar3 = uVar3 + 1) {
          if (uVar3 != local_58[uVar3]) {
            printf("\nFailed circular buffer test (%d != %d)\n");
            EVar1 = TA_INTERNAL_CIRC_BUFF_FAIL_2;
            goto LAB_00114d52;
          }
        }
        local_58[0x10] = 0xffffffff;
        local_58[0x11] = 0xffffffff;
        local_58[0x12] = 0xffffffff;
        local_58[0x13] = 0xffffffff;
        local_58[0xc] = 0xffffffff;
        local_58[0xd] = 0xffffffff;
        local_58[0xe] = 0xffffffff;
        local_58[0xf] = 0xffffffff;
        local_58[8] = 0xffffffff;
        local_58[9] = 0xffffffff;
        local_58[10] = 0xffffffff;
        local_58[0xb] = 0xffffffff;
        local_58[4] = 0xffffffff;
        local_58[5] = 0xffffffff;
        local_58[6] = 0xffffffff;
        local_58[7] = 0xffffffff;
        local_58[0] = 0xffffffff;
        local_58[1] = 0xffffffff;
        local_58[2] = 0xffffffff;
        local_58[3] = 0xffffffff;
        TVar2 = circBufferFillFrom0ToSize(3,(int *)local_58);
        if (TVar2 == TA_SUCCESS) {
          for (uVar3 = 0; uVar3 != 6; uVar3 = uVar3 + 1) {
            if (uVar3 != local_58[uVar3]) {
              printf("\nFailed circular buffer test (%d != %d)\n");
              EVar1 = TA_INTERNAL_CIRC_BUFF_FAIL_3;
              goto LAB_00114d52;
            }
          }
          local_58[0x10] = 0xffffffff;
          local_58[0x11] = 0xffffffff;
          local_58[0x12] = 0xffffffff;
          local_58[0x13] = 0xffffffff;
          local_58[0xc] = 0xffffffff;
          local_58[0xd] = 0xffffffff;
          local_58[0xe] = 0xffffffff;
          local_58[0xf] = 0xffffffff;
          local_58[8] = 0xffffffff;
          local_58[9] = 0xffffffff;
          local_58[10] = 0xffffffff;
          local_58[0xb] = 0xffffffff;
          local_58[4] = 0xffffffff;
          local_58[5] = 0xffffffff;
          local_58[6] = 0xffffffff;
          local_58[7] = 0xffffffff;
          local_58[0] = 0xffffffff;
          local_58[1] = 0xffffffff;
          local_58[2] = 0xffffffff;
          local_58[3] = 0xffffffff;
          TVar2 = circBufferFillFrom0ToSize(4,(int *)local_58);
          if (TVar2 == TA_SUCCESS) {
            for (uVar3 = 0; uVar3 != 7; uVar3 = uVar3 + 1) {
              if (uVar3 != local_58[uVar3]) {
                printf("\nFailed circular buffer test (%d != %d)\n");
                EVar1 = TA_INTERNAL_CIRC_BUFF_FAIL_4;
                goto LAB_00114d52;
              }
            }
            local_58[0x10] = 0xffffffff;
            local_58[0x11] = 0xffffffff;
            local_58[0x12] = 0xffffffff;
            local_58[0x13] = 0xffffffff;
            local_58[0xc] = 0xffffffff;
            local_58[0xd] = 0xffffffff;
            local_58[0xe] = 0xffffffff;
            local_58[0xf] = 0xffffffff;
            local_58[8] = 0xffffffff;
            local_58[9] = 0xffffffff;
            local_58[10] = 0xffffffff;
            local_58[0xb] = 0xffffffff;
            local_58[4] = 0xffffffff;
            local_58[5] = 0xffffffff;
            local_58[6] = 0xffffffff;
            local_58[7] = 0xffffffff;
            local_58[0] = 0xffffffff;
            local_58[1] = 0xffffffff;
            local_58[2] = 0xffffffff;
            local_58[3] = 0xffffffff;
            TVar2 = circBufferFillFrom0ToSize(5,(int *)local_58);
            if (TVar2 == TA_SUCCESS) {
              for (uVar3 = 0; uVar3 != 8; uVar3 = uVar3 + 1) {
                if (uVar3 != local_58[uVar3]) {
                  printf("\nFailed circular buffer test (%d != %d)\n");
                  EVar1 = TA_INTERNAL_CIRC_BUFF_FAIL_5;
                  goto LAB_00114d52;
                }
              }
              local_58[0x10] = 0xffffffff;
              local_58[0x11] = 0xffffffff;
              local_58[0x12] = 0xffffffff;
              local_58[0x13] = 0xffffffff;
              local_58[0xc] = 0xffffffff;
              local_58[0xd] = 0xffffffff;
              local_58[0xe] = 0xffffffff;
              local_58[0xf] = 0xffffffff;
              local_58[8] = 0xffffffff;
              local_58[9] = 0xffffffff;
              local_58[10] = 0xffffffff;
              local_58[0xb] = 0xffffffff;
              local_58[4] = 0xffffffff;
              local_58[5] = 0xffffffff;
              local_58[6] = 0xffffffff;
              local_58[7] = 0xffffffff;
              local_58[0] = 0xffffffff;
              local_58[1] = 0xffffffff;
              local_58[2] = 0xffffffff;
              local_58[3] = 0xffffffff;
              TVar2 = circBufferFillFrom0ToSize(6,(int *)local_58);
              if (TVar2 == TA_SUCCESS) {
                for (uVar3 = 0; uVar3 != 9; uVar3 = uVar3 + 1) {
                  if (uVar3 != local_58[uVar3]) {
                    printf("\nFailed circular buffer test (%d != %d)\n");
                    EVar1 = TA_INTERNAL_CIRC_BUFF_FAIL_6;
                    goto LAB_00114d52;
                  }
                }
                EVar1 = freeLib();
                if (EVar1 == TA_TEST_PASS) {
                  return TA_TEST_PASS;
                }
                goto LAB_00114d52;
              }
            }
          }
        }
      }
    }
    printf("\nFailed circular buffer test RetCode = %d\n",(ulong)TVar2);
    EVar1 = TA_INTERNAL_CIRC_BUFF_FAIL_0;
  }
  else {
    puts("\nFailed: Can\'t initialize the library");
  }
LAB_00114d52:
  printf("\nFailed: Circular buffer tests (%d)\n",(ulong)EVar1);
  return EVar1;
}

Assistant:

ErrorNumber test_internals( void )
{
   ErrorNumber retValue;

   printf( "Testing utility functions\n" );

   retValue = testCircularBuffer();
   if( retValue != TA_TEST_PASS )
   {
      printf( "\nFailed: Circular buffer tests (%d)\n", retValue );
      return retValue;
   }

   return TA_TEST_PASS; /* Success. */
}